

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [16];
  float *in_RDI;
  int in_R8D;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  __m128 _outp;
  __m128 _b;
  __m128 _a_128;
  int i;
  float a;
  binary_op_ratan2 op;
  __m128 special_result;
  __m128 negative_mask_full_x;
  __m128 normal_result;
  __m128 pi_additions;
  __m128 negative_mask_y;
  __m128 negative_mask_x;
  __m128 normal_mode;
  __m128 not_equal_zero_y;
  __m128 not_equal_zero_x;
  __m128 magic_half_pi;
  __m128 magic_pi;
  __m128 magic_negative_zero;
  __m128 magic_zero;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_a8;
  __m128 magic_a7;
  __m128 magic_a6;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_half_pi_1;
  __m128 magic_negative_one;
  __m128 magic_one;
  __m128 magic_negative_zero_1;
  ulong local_dd8;
  ulong uStack_dd0;
  ulong local_db8;
  ulong uStack_db0;
  ulong local_da8;
  ulong uStack_da0;
  int local_d94;
  float local_d90;
  undefined1 local_d89 [5];
  int local_d84;
  float *local_d80;
  undefined1 (*local_d78) [16];
  undefined1 (*local_d68) [16];
  ulong local_d58;
  ulong uStack_d50;
  float *local_d40;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_d28;
  ulong *puStack_d20;
  ulong *local_d18;
  undefined1 *local_d10;
  ulong local_d08;
  ulong uStack_d00;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  ulong local_cd8;
  ulong uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c88;
  int iStack_c84;
  int iStack_c80;
  int iStack_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  ulong local_c38;
  ulong uStack_c30;
  ulong local_c28;
  ulong uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  ulong local_bf8;
  ulong uStack_bf0;
  ulong local_be8;
  ulong uStack_be0;
  ulong local_bd8;
  ulong uStack_bd0;
  ulong local_bc8;
  ulong uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  ulong local_ba8;
  ulong uStack_ba0;
  ulong local_b98;
  ulong uStack_b90;
  ulong local_b88;
  ulong uStack_b80;
  ulong local_b78;
  ulong uStack_b70;
  int local_b68;
  int iStack_b64;
  int iStack_b60;
  int iStack_b5c;
  undefined8 local_b58;
  undefined8 uStack_b50;
  int local_b48;
  int iStack_b44;
  int iStack_b40;
  int iStack_b3c;
  ulong local_b38;
  ulong uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  ulong local_af8;
  ulong uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  uint local_ad8;
  uint uStack_ad4;
  uint uStack_ad0;
  uint uStack_acc;
  ulong local_ac8;
  ulong uStack_ac0;
  ulong local_ab8;
  ulong uStack_ab0;
  ulong local_aa8;
  ulong uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 uStack_984;
  undefined4 uStack_980;
  undefined4 uStack_97c;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 uStack_964;
  undefined4 uStack_960;
  undefined4 uStack_95c;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined4 local_92c;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  undefined1 local_848 [16];
  int local_838;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  ulong local_828;
  ulong uStack_820;
  ulong local_818;
  ulong uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined1 local_738 [16];
  undefined8 local_728;
  undefined8 uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  ulong local_658;
  ulong uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  ulong local_638;
  ulong uStack_630;
  ulong local_628;
  ulong uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  float *local_600;
  float *local_5f8;
  float *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 *local_5a0;
  float *local_598;
  float *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  float *local_538;
  float *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  float *local_4d8;
  float *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 *local_480;
  undefined8 *local_478;
  float *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_420;
  float *local_418;
  float *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 *local_3c0;
  float *local_3b8;
  float *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  undefined8 *local_358;
  float *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  ulong local_308;
  ulong uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 (*local_18) [16];
  float *local_10;
  undefined1 *local_8;
  
  local_d90 = *in_RDI;
  local_d94 = 0;
  if (in_R8D == 4) {
    local_dd8 = *(ulong *)in_RDI;
    uStack_dd0 = *(ulong *)(in_RDI + 2);
  }
  else {
    local_dd8 = CONCAT44(local_d90,local_d90);
    uStack_dd0 = CONCAT44(local_d90,local_d90);
    local_d38 = local_d90;
    fStack_d34 = local_d90;
    fStack_d30 = local_d90;
    fStack_d2c = local_d90;
    local_d28 = local_d90;
  }
  local_da8 = local_dd8;
  uStack_da0 = uStack_dd0;
  local_d80 = in_RDX;
  local_d78 = in_RSI;
  for (; local_d84 = in_ECX, local_d94 + 3 < in_ECX; local_d94 = local_d94 + 4) {
    local_d68 = local_d78;
    local_db8 = *(ulong *)*local_d78;
    uStack_db0 = *(ulong *)(*local_d78 + 8);
    local_d10 = local_d89;
    local_d18 = &local_da8;
    puStack_d20 = &local_db8;
    local_c38 = local_dd8;
    uStack_c30 = uStack_dd0;
    auVar3._8_8_ = uStack_dd0;
    auVar3._0_8_ = local_dd8;
    local_94c = 0;
    local_92c = 0;
    local_948 = 0;
    local_c48 = 0;
    uStack_c40 = 0;
    local_96c = 0x80000000;
    local_950 = 0x80000000;
    local_968 = 0x80000000;
    local_c58 = 0x8000000080000000;
    uStack_c50 = 0x8000000080000000;
    local_98c = 0x40490fdb;
    local_970 = 0x40490fdb;
    local_988 = 0x40490fdb;
    local_c68 = 0x40490fdb40490fdb;
    uStack_c60 = 0x40490fdb40490fdb;
    local_9ac = 0x3fc90fdb;
    local_990 = 0x3fc90fdb;
    local_9a8 = 0x3fc90fdb;
    local_c78 = 0x3fc90fdb3fc90fdb;
    uStack_c70 = 0x3fc90fdb3fc90fdb;
    local_8f8._0_4_ = (float)local_dd8;
    local_8f8._4_4_ = (float)(local_dd8 >> 0x20);
    uStack_8f0._0_4_ = (float)uStack_dd0;
    uStack_8f0._4_4_ = (float)(uStack_dd0 >> 0x20);
    local_c88 = -(uint)((float)local_8f8 != 0.0);
    iStack_c84 = -(uint)(local_8f8._4_4_ != 0.0);
    iStack_c80 = -(uint)((float)uStack_8f0 != 0.0);
    iStack_c7c = -(uint)(uStack_8f0._4_4_ != 0.0);
    local_918._0_4_ = (float)local_db8;
    local_918._4_4_ = (float)(local_db8 >> 0x20);
    uStack_910._0_4_ = (float)uStack_db0;
    uStack_910._4_4_ = (float)(uStack_db0 >> 0x20);
    local_c98 = -(uint)((float)local_918 != 0.0);
    iStack_c94 = -(uint)(local_918._4_4_ != 0.0);
    iStack_c90 = -(uint)((float)uStack_910 != 0.0);
    iStack_c8c = -(uint)(uStack_910._4_4_ != 0.0);
    local_ae8 = CONCAT44(iStack_c84,local_c88);
    uStack_ae0 = CONCAT44(iStack_c7c,iStack_c80);
    local_af8 = CONCAT44(iStack_c94,local_c98);
    uStack_af0 = CONCAT44(iStack_c8c,iStack_c90);
    local_ca8 = local_ae8 & local_af8;
    uStack_ca0 = uStack_ae0 & uStack_af0;
    local_cb8 = local_dd8 & 0x8000000080000000;
    uStack_cb0 = uStack_dd0 & 0x8000000080000000;
    local_cc8 = local_db8 & 0x8000000080000000;
    uStack_cc0 = uStack_db0 & 0x8000000080000000;
    local_b68 = -(uint)((float)local_8f8 < 0.0);
    iStack_b64 = -(uint)(local_8f8._4_4_ < 0.0);
    iStack_b60 = -(uint)((float)uStack_8f0 < 0.0);
    iStack_b5c = -(uint)(uStack_8f0._4_4_ < 0.0);
    local_b48 = -(uint)((float)local_918 < 0.0);
    iStack_b44 = -(uint)(local_918._4_4_ < 0.0);
    iStack_b40 = -(uint)((float)uStack_910 < 0.0);
    iStack_b3c = -(uint)(uStack_910._4_4_ < 0.0);
    local_a28 = CONCAT44(iStack_b44,local_b48) & 0x8000000080000000;
    uStack_a20 = CONCAT44(iStack_b3c,iStack_b40) & 0x8000000080000000;
    local_b78 = local_a28 | 0x40490fdb40490fdb;
    uStack_b70 = uStack_a20 | 0x40490fdb40490fdb;
    local_cd8 = CONCAT44(iStack_b64,local_b68) & local_b78;
    uStack_cd0 = CONCAT44(iStack_b5c,iStack_b60) & uStack_b70;
    local_738 = divps(*local_d78,auVar3);
    local_fc = 0x80000000;
    local_dc = 0x80000000;
    local_f8 = 0x80000000;
    local_748 = 0x8000000080000000;
    uStack_740 = 0x8000000080000000;
    local_11c = 0x3f800000;
    local_100 = 0x3f800000;
    local_118 = 0x3f800000;
    local_758 = 0x3f8000003f800000;
    uStack_750 = 0x3f8000003f800000;
    local_13c = 0xbf800000;
    local_120 = 0xbf800000;
    local_138 = 0xbf800000;
    local_768 = 0xbf800000bf800000;
    uStack_760 = 0xbf800000bf800000;
    local_15c = 0x3fc90fdb;
    local_140 = 0x3fc90fdb;
    local_158 = 0x3fc90fdb;
    local_778 = 0x3fc90fdb3fc90fdb;
    uStack_770 = 0x3fc90fdb3fc90fdb;
    local_17c = 0x3f800000;
    local_160 = 0x3f800000;
    local_178 = 0x3f800000;
    local_788 = 0x3f8000003f800000;
    uStack_780 = 0x3f8000003f800000;
    local_19c = 0xbeaaaa53;
    local_180 = 0xbeaaaa53;
    local_198 = 0xbeaaaa53;
    local_798 = 0xbeaaaa53beaaaa53;
    uStack_790 = 0xbeaaaa53beaaaa53;
    local_1bc = 0x3e4cb974;
    local_1a0 = 0x3e4cb974;
    local_1b8 = 0x3e4cb974;
    local_7a8 = 0x3e4cb9743e4cb974;
    uStack_7a0 = 0x3e4cb9743e4cb974;
    local_1dc = 0xbe117200;
    local_1c0 = 0xbe117200;
    local_1d8 = 0xbe117200;
    local_7b8 = 0xbe117200be117200;
    uStack_7b0 = 0xbe117200be117200;
    local_1fc = 0x3dd9ed24;
    local_1e0 = 0x3dd9ed24;
    local_1f8 = 0x3dd9ed24;
    local_7c8 = 0x3dd9ed243dd9ed24;
    uStack_7c0 = 0x3dd9ed243dd9ed24;
    local_21c = 0xbd99b01e;
    local_200 = 0xbd99b01e;
    local_218 = 0xbd99b01e;
    local_7d8 = 0xbd99b01ebd99b01e;
    uStack_7d0 = 0xbd99b01ebd99b01e;
    local_23c = 0x3d2edd4e;
    local_220 = 0x3d2edd4e;
    local_238 = 0x3d2edd4e;
    local_7e8 = 0x3d2edd4e3d2edd4e;
    uStack_7e0 = 0x3d2edd4e3d2edd4e;
    local_25c = 0xbc83a25c;
    local_240 = 0xbc83a25c;
    local_258 = 0xbc83a25c;
    local_7f8 = 0xbc83a25cbc83a25c;
    uStack_7f0 = 0xbc83a25cbc83a25c;
    local_27c = 0x3b3ac537;
    local_260 = 0x3b3ac537;
    local_278 = 0x3b3ac537;
    local_808 = 0x3b3ac5373b3ac537;
    uStack_800 = 0x3b3ac5373b3ac537;
    local_628 = local_738._0_8_;
    uStack_620 = local_738._8_8_;
    local_818 = local_738._0_8_ & 0x8000000080000000;
    uStack_810 = local_738._8_8_ & 0x8000000080000000;
    local_98 = local_738._0_8_;
    uStack_90 = local_738._8_8_;
    local_828 = local_738._0_8_ & 0x7fffffff7fffffff;
    uStack_820 = local_738._8_8_ & 0x7fffffff7fffffff;
    local_2a8._0_4_ = (float)local_828;
    local_2a8._4_4_ = (float)(local_828 >> 0x20);
    uStack_2a0._0_4_ = (float)uStack_820;
    uStack_2a0._4_4_ = (float)(uStack_820 >> 0x20);
    local_838 = -(uint)(1.0 < (float)local_2a8);
    iStack_834 = -(uint)(1.0 < local_2a8._4_4_);
    iStack_830 = -(uint)(1.0 < (float)uStack_2a0);
    iStack_82c = -(uint)(1.0 < uStack_2a0._4_4_);
    local_638 = CONCAT44(iStack_834,local_838);
    uStack_630 = CONCAT44(iStack_82c,iStack_830);
    local_2b8 = local_638 & 0xbf800000bf800000;
    uStack_2b0 = uStack_630 & 0xbf800000bf800000;
    local_a8 = CONCAT44(iStack_834,local_838);
    uStack_a0 = CONCAT44(iStack_82c,iStack_830);
    local_2c8 = ~local_a8 & local_828;
    uStack_2c0 = ~uStack_a0 & uStack_820;
    local_698 = local_2b8 | local_2c8;
    uStack_690 = uStack_2b0 | uStack_2c0;
    local_658 = CONCAT44(iStack_834,local_838);
    uStack_650 = CONCAT44(iStack_82c,iStack_830);
    local_2d8 = local_658 & local_828;
    uStack_2d0 = uStack_650 & uStack_820;
    local_c8 = CONCAT44(iStack_834,local_838);
    uStack_c0 = CONCAT44(iStack_82c,iStack_830);
    local_2e8 = ~local_c8 & 0x3f8000003f800000;
    uStack_2e0 = ~uStack_c0 & 0x3f8000003f800000;
    local_6a8 = local_2d8 | local_2e8;
    uStack_6a0 = uStack_2d0 | uStack_2e0;
    auVar2._8_8_ = uStack_690;
    auVar2._0_8_ = local_698;
    auVar1._8_8_ = uStack_6a0;
    auVar1._0_8_ = local_6a8;
    local_848 = divps(auVar2,auVar1);
    local_6c8 = local_848._0_8_;
    uStack_6c0 = local_848._8_8_;
    local_6b8._0_4_ = local_848._0_4_;
    local_6b8._4_4_ = local_848._4_4_;
    uStack_6b0._0_4_ = local_848._8_4_;
    uStack_6b0._4_4_ = local_848._12_4_;
    local_858 = (float)local_6b8 * (float)local_6b8;
    fStack_854 = local_6b8._4_4_ * local_6b8._4_4_;
    fStack_850 = (float)uStack_6b0 * (float)uStack_6b0;
    fStack_84c = uStack_6b0._4_4_ * uStack_6b0._4_4_;
    local_6e8 = CONCAT44(fStack_854,local_858);
    uStack_6e0 = CONCAT44(fStack_84c,fStack_850);
    local_868 = local_858 * local_858;
    fStack_864 = fStack_854 * fStack_854;
    fStack_860 = fStack_850 * fStack_850;
    fStack_85c = fStack_84c * fStack_84c;
    local_590 = &local_868;
    local_358 = &local_7f8;
    local_360 = &local_7d8;
    local_318 = CONCAT44(fStack_864,local_868);
    uStack_310 = CONCAT44(fStack_85c,fStack_860);
    local_328 = 0xbc83a25cbc83a25c;
    uStack_320 = 0xbc83a25cbc83a25c;
    local_338 = local_868 * -0.01606863;
    fStack_334 = fStack_864 * -0.01606863;
    fStack_330 = fStack_860 * -0.01606863;
    fStack_32c = fStack_85c * -0.01606863;
    local_348 = 0xbd99b01ebd99b01e;
    uStack_340 = 0xbd99b01ebd99b01e;
    local_8a8 = local_338 + -0.07504295;
    fStack_8a4 = fStack_334 + -0.07504295;
    fStack_8a0 = fStack_330 + -0.07504295;
    fStack_89c = fStack_32c + -0.07504295;
    local_3b8 = &local_8a8;
    local_3c0 = &local_7b8;
    local_378 = CONCAT44(fStack_864,local_868);
    uStack_370 = CONCAT44(fStack_85c,fStack_860);
    local_388 = CONCAT44(fStack_8a4,local_8a8);
    uStack_380 = CONCAT44(fStack_89c,fStack_8a0);
    local_398 = local_868 * local_8a8;
    fStack_394 = fStack_864 * fStack_8a4;
    fStack_390 = fStack_860 * fStack_8a0;
    fStack_38c = fStack_85c * fStack_89c;
    local_3a8 = 0xbe117200be117200;
    uStack_3a0 = 0xbe117200be117200;
    local_898 = local_398 + -0.14203644;
    fStack_894 = fStack_394 + -0.14203644;
    fStack_890 = fStack_390 + -0.14203644;
    fStack_88c = fStack_38c + -0.14203644;
    local_418 = &local_898;
    local_420 = &local_798;
    local_3d8 = CONCAT44(fStack_864,local_868);
    uStack_3d0 = CONCAT44(fStack_85c,fStack_860);
    local_3e8 = CONCAT44(fStack_894,local_898);
    uStack_3e0 = CONCAT44(fStack_88c,fStack_890);
    local_3f8 = local_868 * local_898;
    fStack_3f4 = fStack_864 * fStack_894;
    fStack_3f0 = fStack_860 * fStack_890;
    fStack_3ec = fStack_85c * fStack_88c;
    local_408 = 0xbeaaaa53beaaaa53;
    uStack_400 = 0xbeaaaa53beaaaa53;
    local_888 = local_3f8 + -0.33333072;
    fStack_884 = fStack_3f4 + -0.33333072;
    fStack_880 = fStack_3f0 + -0.33333072;
    fStack_87c = fStack_3ec + -0.33333072;
    local_478 = &local_808;
    local_480 = &local_7e8;
    local_438 = CONCAT44(fStack_864,local_868);
    uStack_430 = CONCAT44(fStack_85c,fStack_860);
    local_448 = 0x3b3ac5373b3ac537;
    uStack_440 = 0x3b3ac5373b3ac537;
    local_458 = local_868 * 0.0028498897;
    fStack_454 = fStack_864 * 0.0028498897;
    fStack_450 = fStack_860 * 0.0028498897;
    fStack_44c = fStack_85c * 0.0028498897;
    local_468 = 0x3d2edd4e3d2edd4e;
    uStack_460 = 0x3d2edd4e3d2edd4e;
    local_8e8 = local_458 + 0.04269152;
    fStack_8e4 = fStack_454 + 0.04269152;
    fStack_8e0 = fStack_450 + 0.04269152;
    fStack_8dc = fStack_44c + 0.04269152;
    local_4d8 = &local_8e8;
    local_4e0 = &local_7c8;
    local_498 = CONCAT44(fStack_864,local_868);
    uStack_490 = CONCAT44(fStack_85c,fStack_860);
    local_4a8 = CONCAT44(fStack_8e4,local_8e8);
    uStack_4a0 = CONCAT44(fStack_8dc,fStack_8e0);
    local_4b8 = local_868 * local_8e8;
    fStack_4b4 = fStack_864 * fStack_8e4;
    fStack_4b0 = fStack_860 * fStack_8e0;
    fStack_4ac = fStack_85c * fStack_8dc;
    local_4c8 = 0x3dd9ed243dd9ed24;
    uStack_4c0 = 0x3dd9ed243dd9ed24;
    local_8d8 = local_4b8 + 0.10640934;
    fStack_8d4 = fStack_4b4 + 0.10640934;
    fStack_8d0 = fStack_4b0 + 0.10640934;
    fStack_8cc = fStack_4ac + 0.10640934;
    local_538 = &local_8d8;
    local_540 = &local_7a8;
    local_4f8 = CONCAT44(fStack_864,local_868);
    uStack_4f0 = CONCAT44(fStack_85c,fStack_860);
    local_508 = CONCAT44(fStack_8d4,local_8d8);
    uStack_500 = CONCAT44(fStack_8cc,fStack_8d0);
    local_518 = local_868 * local_8d8;
    fStack_514 = fStack_864 * fStack_8d4;
    fStack_510 = fStack_860 * fStack_8d0;
    fStack_50c = fStack_85c * fStack_8cc;
    local_528 = 0x3e4cb9743e4cb974;
    uStack_520 = 0x3e4cb9743e4cb974;
    local_8c8 = local_518 + 0.1999262;
    fStack_8c4 = fStack_514 + 0.1999262;
    fStack_8c0 = fStack_510 + 0.1999262;
    fStack_8bc = fStack_50c + 0.1999262;
    local_598 = &local_8c8;
    local_5a0 = &local_788;
    local_558 = CONCAT44(fStack_864,local_868);
    uStack_550 = CONCAT44(fStack_85c,fStack_860);
    local_568 = CONCAT44(fStack_8c4,local_8c8);
    uStack_560 = CONCAT44(fStack_8bc,fStack_8c0);
    local_578 = local_868 * local_8c8;
    fStack_574 = fStack_864 * fStack_8c4;
    fStack_570 = fStack_860 * fStack_8c0;
    fStack_56c = fStack_85c * fStack_8bc;
    local_588 = 0x3f8000003f800000;
    uStack_580 = 0x3f8000003f800000;
    local_8b8 = local_578 + 1.0;
    fStack_8b4 = fStack_574 + 1.0;
    fStack_8b0 = fStack_570 + 1.0;
    fStack_8ac = fStack_56c + 1.0;
    local_5f0 = &local_858;
    local_5f8 = &local_888;
    local_600 = &local_8b8;
    local_5b8 = CONCAT44(fStack_854,local_858);
    uStack_5b0 = CONCAT44(fStack_84c,fStack_850);
    local_5c8 = CONCAT44(fStack_884,local_888);
    uStack_5c0 = CONCAT44(fStack_87c,fStack_880);
    local_5d8 = local_858 * local_888;
    fStack_5d4 = fStack_854 * fStack_884;
    fStack_5d0 = fStack_850 * fStack_880;
    fStack_5cc = fStack_84c * fStack_87c;
    local_5e8 = CONCAT44(fStack_8b4,local_8b8);
    uStack_5e0 = CONCAT44(fStack_8ac,fStack_8b0);
    local_878 = local_5d8 + local_8b8;
    fStack_874 = fStack_5d4 + fStack_8b4;
    fStack_870 = fStack_5d0 + fStack_8b0;
    fStack_86c = fStack_5cc + fStack_8ac;
    local_6f8 = CONCAT44(fStack_874,local_878);
    uStack_6f0 = CONCAT44(fStack_86c,fStack_870);
    local_708 = local_848._0_8_;
    uStack_700 = local_848._8_8_;
    local_718 = local_878 * (float)local_6b8;
    fStack_714 = fStack_874 * local_6b8._4_4_;
    fStack_710 = fStack_870 * (float)uStack_6b0;
    fStack_70c = fStack_86c * uStack_6b0._4_4_;
    local_678 = CONCAT44(iStack_834,local_838);
    uStack_670 = CONCAT44(iStack_82c,iStack_830);
    uVar5 = local_678 & 0x3fc90fdb3fc90fdb;
    uVar6 = uStack_670 & 0x3fc90fdb3fc90fdb;
    local_728._0_4_ = (float)uVar5;
    local_728._4_4_ = (float)(uVar5 >> 0x20);
    uStack_720._0_4_ = (float)uVar6;
    uStack_720._4_4_ = (float)(uVar6 >> 0x20);
    local_2f8 = local_718 + (float)local_728;
    fStack_2f4 = fStack_714 + local_728._4_4_;
    fStack_2f0 = fStack_710 + (float)uStack_720;
    fStack_2ec = fStack_70c + uStack_720._4_4_;
    uVar7 = CONCAT44(fStack_2f4,local_2f8) | local_818;
    uVar9 = CONCAT44(fStack_2ec,fStack_2f0) | uStack_810;
    local_c08._0_4_ = (float)uVar7;
    local_c08._4_4_ = (float)(uVar7 >> 0x20);
    uStack_c00._0_4_ = (float)uVar9;
    uStack_c00._4_4_ = (float)(uVar9 >> 0x20);
    local_c18._0_4_ = (float)local_cd8;
    local_c18._4_4_ = (float)(local_cd8 >> 0x20);
    uStack_c10._0_4_ = (float)uStack_cd0;
    uStack_c10._4_4_ = (float)(uStack_cd0 >> 0x20);
    local_ce8 = (float)local_c08 + (float)local_c18;
    fStack_ce4 = local_c08._4_4_ + local_c18._4_4_;
    fStack_ce0 = (float)uStack_c00 + (float)uStack_c10;
    fStack_cdc = uStack_c00._4_4_ + uStack_c10._4_4_;
    uVar8 = local_cb8 | 0x40490fdb40490fdb;
    uVar10 = uStack_cb0 | 0x40490fdb40490fdb;
    local_a08._0_4_ = (float)uVar8;
    local_a08._4_4_ = (float)(uVar8 >> 0x20);
    uStack_a00._0_4_ = (float)uVar10;
    uStack_a00._4_4_ = (float)(uVar10 >> 0x20);
    local_cf8 = -(uint)((float)local_a08 < 0.0);
    iStack_cf4 = -(uint)(local_a08._4_4_ < 0.0);
    iStack_cf0 = -(uint)((float)uStack_a00 < 0.0);
    iStack_cec = -(uint)(uStack_a00._4_4_ < 0.0);
    local_b88 = CONCAT44(iStack_c94,local_c98);
    uStack_b80 = CONCAT44(iStack_c8c,iStack_c90);
    local_b98 = local_cc8 | 0x3fc90fdb3fc90fdb;
    uStack_b90 = uStack_cc0 | 0x3fc90fdb3fc90fdb;
    local_aa8 = local_b88 & local_b98;
    uStack_aa0 = uStack_b80 & uStack_b90;
    local_48 = CONCAT44(iStack_c94,local_c98);
    uStack_40 = CONCAT44(iStack_c8c,iStack_c90);
    local_ba8 = CONCAT44(iStack_cf4,local_cf8);
    uStack_ba0 = CONCAT44(iStack_cec,iStack_cf0);
    local_a88 = local_ba8 & 0x40490fdb40490fdb;
    uStack_a80 = uStack_ba0 & 0x40490fdb40490fdb;
    local_28 = CONCAT44(iStack_cf4,local_cf8);
    uStack_20 = CONCAT44(iStack_cec,iStack_cf0);
    local_a98 = 0;
    uStack_a90 = 0;
    local_ab8 = ~local_48 & local_a88;
    uStack_ab0 = ~uStack_40 & uStack_a80;
    local_d08 = local_aa8 | local_ab8;
    uStack_d00 = uStack_aa0 | uStack_ab0;
    local_bd8 = CONCAT44(fStack_ce4,local_ce8);
    uStack_bd0 = CONCAT44(fStack_cdc,fStack_ce0);
    local_ac8 = local_ca8 & local_bd8;
    uStack_ac0 = uStack_ca0 & uStack_bd0;
    local_68._0_4_ = (uint)local_ca8;
    local_68._4_4_ = (uint)(local_ca8 >> 0x20);
    uStack_60._0_4_ = (uint)uStack_ca0;
    uStack_60._4_4_ = (uint)(uStack_ca0 >> 0x20);
    local_78._0_4_ = (uint)local_d08;
    local_78._4_4_ = (uint)(local_d08 >> 0x20);
    uStack_70._0_4_ = (uint)uStack_d00;
    uStack_70._4_4_ = (uint)(uStack_d00 >> 0x20);
    local_ad8 = ((uint)local_68 ^ 0xffffffff) & (uint)local_78;
    uStack_ad4 = (local_68._4_4_ ^ 0xffffffff) & local_78._4_4_;
    uStack_ad0 = ((uint)uStack_60 ^ 0xffffffff) & (uint)uStack_70;
    uStack_acc = (uStack_60._4_4_ ^ 0xffffffff) & uStack_70._4_4_;
    local_d58 = local_ac8 | CONCAT44(uStack_ad4,local_ad8);
    uStack_d50 = uStack_ac0 | CONCAT44(uStack_acc,uStack_ad0);
    local_d40 = local_d80;
    *(ulong *)local_d80 = local_d58;
    *(ulong *)(local_d80 + 2) = uStack_d50;
    local_d78 = local_d78 + 1;
    local_d80 = local_d80 + 4;
    local_c28 = local_db8;
    uStack_c20 = uStack_db0;
    local_c18 = local_cd8;
    uStack_c10 = uStack_cd0;
    local_c08 = uVar7;
    uStack_c00 = uVar9;
    local_bf8 = local_c38;
    uStack_bf0 = uStack_c30;
    local_be8 = local_db8;
    uStack_be0 = uStack_db0;
    local_bc8 = local_ca8;
    uStack_bc0 = uStack_ca0;
    local_bb8 = local_c68;
    uStack_bb0 = uStack_c60;
    local_b58 = local_c58;
    uStack_b50 = uStack_c50;
    local_b38 = local_db8;
    uStack_b30 = uStack_db0;
    local_b28 = local_c58;
    uStack_b20 = uStack_c50;
    local_b18 = local_c38;
    uStack_b10 = uStack_c30;
    local_b08 = local_c58;
    uStack_b00 = uStack_c50;
    local_a78 = local_c78;
    uStack_a70 = uStack_c70;
    local_a68 = local_cc8;
    uStack_a60 = uStack_cc0;
    local_a58 = local_c68;
    uStack_a50 = uStack_c60;
    local_a48 = local_cb8;
    uStack_a40 = uStack_cb0;
    local_a38 = local_c68;
    uStack_a30 = uStack_c60;
    local_a18 = local_c48;
    uStack_a10 = uStack_c40;
    local_a08 = uVar8;
    uStack_a00 = uVar10;
    local_9f8 = local_c48;
    uStack_9f0 = uStack_c40;
    local_9e8 = local_db8;
    uStack_9e0 = uStack_db0;
    local_9d8 = local_c48;
    uStack_9d0 = uStack_c40;
    local_9c8 = local_c38;
    uStack_9c0 = uStack_c30;
    uStack_9a4 = local_9a8;
    uStack_9a0 = local_9a8;
    uStack_99c = local_9a8;
    uStack_984 = local_988;
    uStack_980 = local_988;
    uStack_97c = local_988;
    uStack_964 = local_968;
    uStack_960 = local_968;
    uStack_95c = local_968;
    uStack_944 = local_948;
    uStack_940 = local_948;
    uStack_93c = local_948;
    local_928 = local_c48;
    uStack_920 = uStack_c40;
    local_918 = local_db8;
    uStack_910 = uStack_db0;
    local_908 = local_c48;
    uStack_900 = uStack_c40;
    local_8f8 = local_c38;
    uStack_8f0 = uStack_c30;
    local_728 = uVar5;
    uStack_720 = uVar6;
    local_6d8 = local_6e8;
    uStack_6d0 = uStack_6e0;
    local_6b8 = local_6c8;
    uStack_6b0 = uStack_6c0;
    local_688 = local_778;
    uStack_680 = uStack_770;
    local_668 = local_828;
    uStack_660 = uStack_820;
    local_648 = local_768;
    uStack_640 = uStack_760;
    local_618 = local_748;
    uStack_610 = uStack_740;
    local_530 = local_590;
    local_4d0 = local_590;
    local_470 = local_590;
    local_410 = local_590;
    local_3b0 = local_590;
    local_350 = local_590;
    local_308 = local_818;
    uStack_300 = uStack_810;
    local_2a8 = local_828;
    uStack_2a0 = uStack_820;
    local_298 = local_758;
    uStack_290 = uStack_750;
    uStack_274 = local_278;
    uStack_270 = local_278;
    uStack_26c = local_278;
    uStack_254 = local_258;
    uStack_250 = local_258;
    uStack_24c = local_258;
    uStack_234 = local_238;
    uStack_230 = local_238;
    uStack_22c = local_238;
    uStack_214 = local_218;
    uStack_210 = local_218;
    uStack_20c = local_218;
    uStack_1f4 = local_1f8;
    uStack_1f0 = local_1f8;
    uStack_1ec = local_1f8;
    uStack_1d4 = local_1d8;
    uStack_1d0 = local_1d8;
    uStack_1cc = local_1d8;
    uStack_1b4 = local_1b8;
    uStack_1b0 = local_1b8;
    uStack_1ac = local_1b8;
    uStack_194 = local_198;
    uStack_190 = local_198;
    uStack_18c = local_198;
    uStack_174 = local_178;
    uStack_170 = local_178;
    uStack_16c = local_178;
    uStack_154 = local_158;
    uStack_150 = local_158;
    uStack_14c = local_158;
    uStack_134 = local_138;
    uStack_130 = local_138;
    uStack_12c = local_138;
    uStack_114 = local_118;
    uStack_110 = local_118;
    uStack_10c = local_118;
    uStack_f4 = local_f8;
    uStack_f0 = local_f8;
    uStack_ec = local_f8;
    local_d8 = local_758;
    uStack_d0 = uStack_750;
    local_b8 = local_828;
    uStack_b0 = uStack_820;
    local_88 = local_748;
    uStack_80 = uStack_740;
    local_78 = local_d08;
    uStack_70 = uStack_d00;
    local_68 = local_ca8;
    uStack_60 = uStack_ca0;
    local_58 = local_a88;
    uStack_50 = uStack_a80;
    local_38 = local_c48;
    uStack_30 = uStack_c40;
  }
  for (; local_d94 < local_d84; local_d94 = local_d94 + 1) {
    local_8 = local_d89;
    local_10 = &local_d90;
    local_18 = local_d78;
    fVar4 = atan2f(*(float *)*local_d78,local_d90);
    *local_d80 = fVar4;
    local_d78 = (undefined1 (*) [16])(*local_d78 + 4);
    local_d80 = local_d80 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}